

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,long right,ValidityMask *mask,
                   idx_t idx)

{
  undefined4 *puVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  bool bVar3;
  ulong uVar4;
  OutOfRangeException *this;
  undefined4 *__dest;
  ulong params_1;
  long lVar5;
  void *__src;
  bool bVar6;
  undefined1 auVar7 [16];
  string_t result_str;
  idx_t copy_size;
  string local_68;
  ulong local_48;
  undefined8 local_40;
  void *local_38;
  
  local_38 = left.value._8_8_;
  local_40 = left.value._0_8_;
  uVar4 = local_40 & 0xffffffff;
  bVar6 = ((undefined1  [16])left.value & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0;
  __src = local_38;
  if (uVar4 < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  params_1 = 0;
  if (0 < right && bVar6) {
    params_1 = right;
  }
  bVar3 = duckdb::TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (uVar4,params_1,&local_48);
  if (bVar3) {
    auVar7 = duckdb::StringVector::EmptyString(fun.result,local_48);
    local_68._M_string_length = auVar7._8_8_;
    puVar1 = (undefined4 *)((long)&local_68._M_dataplus._M_p + 4);
    local_68._M_dataplus._M_p._0_4_ = auVar7._0_4_;
    local_68._M_dataplus._M_p._4_4_ = auVar7._4_4_;
    __dest = (undefined4 *)local_68._M_string_length;
    if ((uint)local_68._M_dataplus._M_p < 0xd) {
      __dest = puVar1;
    }
    if (0 < right && bVar6) {
      lVar5 = params_1 + (params_1 == 0);
      do {
        memcpy(__dest,__src,uVar4);
        __dest = (undefined4 *)((long)__dest + uVar4);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    uVar4 = (ulong)(uint)local_68._M_dataplus._M_p;
    if (uVar4 < 0xd) {
      memset((void *)((long)puVar1 + uVar4),0,0xc - uVar4);
    }
    else {
      local_68._M_dataplus._M_p._4_4_ = *(undefined4 *)local_68._M_string_length;
    }
    aVar2._4_1_ = local_68._M_dataplus._M_p._4_1_;
    aVar2._5_1_ = local_68._M_dataplus._M_p._5_1_;
    aVar2._6_1_ = local_68._M_dataplus._M_p._6_1_;
    aVar2._7_1_ = local_68._M_dataplus._M_p._7_1_;
    aVar2.pointer.length = (uint)local_68._M_dataplus._M_p;
    aVar2.pointer.ptr = (char *)local_68._M_string_length;
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Cannot create a string of size: \'%d\' * \'%d\', the maximum supported string size is: \'%d\'"
             ,"");
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
            (this,&local_68,uVar4,params_1,0xffffffff);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}